

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_MappingTag::Write(ON_MappingTag *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,1);
  if (bVar1) {
    bVar2 = ON_BinaryArchive::WriteUuid(archive,&this->m_mapping_id);
    if (bVar2) {
      bVar2 = ON_BinaryArchive::WriteInt(archive,this->m_mapping_crc);
      if (bVar2) {
        bVar2 = ON_BinaryArchive::WriteXform(archive,&this->m_mesh_xform);
        if (bVar2) {
          bVar2 = ON_BinaryArchive::WriteInt(archive,this->m_mapping_type);
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_MappingTag::Write(ON_BinaryArchive& archive) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,1);
  if (!rc)
    return false;

  for(;;)
  {
    rc = archive.WriteUuid(m_mapping_id);
    if(!rc) break;
    rc = archive.WriteInt(m_mapping_crc);
    if(!rc) break;
    rc = archive.WriteXform(m_mesh_xform);
    if(!rc) break;

    // 1.1 fields
    rc = archive.WriteInt(static_cast<unsigned int>(m_mapping_type));
    if (!rc) break;

    break;
  }

  if ( !archive.EndWrite3dmChunk() )
    rc = false;
  
  return rc;
}